

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

bool __thiscall cmake::PrintMessagePreamble(cmake *this,MessageType t,ostream *msg)

{
  cmState *this_00;
  bool bVar1;
  char *pcVar2;
  long lVar3;
  string local_48;
  
  switch(t) {
  case FATAL_ERROR:
    pcVar2 = "CMake Error";
    lVar3 = 0xb;
    break;
  case INTERNAL_ERROR:
    pcVar2 = "CMake Internal Error (please report a bug)";
    lVar3 = 0x2a;
    break;
  default:
    std::__ostream_insert<char,std::char_traits<char>>(msg,"CMake Warning",0xd);
    if (t != AUTHOR_WARNING) {
      return true;
    }
    this_00 = this->State;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS","");
    pcVar2 = cmState::GetCacheEntryValue(this_00,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if ((pcVar2 != (char *)0x0) && (bVar1 = cmSystemTools::IsOn(pcVar2), bVar1)) {
      return false;
    }
    std::__ostream_insert<char,std::char_traits<char>>(msg," (dev)",6);
    return true;
  case LOG:
    pcVar2 = "CMake Debug Log";
    lVar3 = 0xf;
    break;
  case DEPRECATION_ERROR:
    pcVar2 = "CMake Deprecation Error";
    lVar3 = 0x17;
    break;
  case DEPRECATION_WARNING:
    pcVar2 = "CMake Deprecation Warning";
    lVar3 = 0x19;
  }
  std::__ostream_insert<char,std::char_traits<char>>(msg,pcVar2,lVar3);
  return true;
}

Assistant:

bool cmake::PrintMessagePreamble(cmake::MessageType t, std::ostream& msg)
{
  // Construct the message header.
  if(t == cmake::FATAL_ERROR)
    {
    msg << "CMake Error";
    }
  else if(t == cmake::INTERNAL_ERROR)
    {
    msg << "CMake Internal Error (please report a bug)";
    }
  else if(t == cmake::LOG)
    {
    msg << "CMake Debug Log";
    }
  else if(t == cmake::DEPRECATION_ERROR)
    {
    msg << "CMake Deprecation Error";
    }
  else if (t == cmake::DEPRECATION_WARNING)
    {
    msg << "CMake Deprecation Warning";
    }
  else
    {
    msg << "CMake Warning";
    if(t == cmake::AUTHOR_WARNING)
      {
      // Allow suppression of these warnings.
      const char* suppress = this->State->GetCacheEntryValue(
                                        "CMAKE_SUPPRESS_DEVELOPER_WARNINGS");
      if(suppress && cmSystemTools::IsOn(suppress))
        {
        return false;
        }
      msg << " (dev)";
      }
    }
  return true;
}